

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# numparse_affixes.cpp
# Opt level: O0

void __thiscall
icu_63::numparse::impl::AffixPatternMatcherBuilder::consumeToken
          (AffixPatternMatcherBuilder *this,AffixPatternType type,UChar32 cp,UErrorCode *status)

{
  UBool UVar1;
  UnicodeSet *pUVar2;
  NumberParseMatcher *pNVar3;
  AffixPatternType local_34;
  UErrorCode *status_local;
  UChar32 cp_local;
  AffixPatternType type_local;
  AffixPatternMatcherBuilder *this_local;
  
  if ((this->fIgnorables != (IgnorablesMatcher *)0x0) && (0 < this->fMatchersLen)) {
    if (-1 < this->fLastTypeOrCp) {
      pUVar2 = SymbolMatcher::getSet(&this->fIgnorables->super_SymbolMatcher);
      UVar1 = UnicodeSet::contains(pUVar2,this->fLastTypeOrCp);
      if (UVar1 != '\0') goto LAB_0031b7b7;
    }
    (*(this->super_TokenConsumer)._vptr_TokenConsumer[3])(this,this->fIgnorables);
  }
LAB_0031b7b7:
  if (type == TYPE_CODEPOINT) {
    if (this->fIgnorables != (IgnorablesMatcher *)0x0) {
      pUVar2 = SymbolMatcher::getSet(&this->fIgnorables->super_SymbolMatcher);
      UVar1 = UnicodeSet::contains(pUVar2,cp);
      if (UVar1 != '\0') goto switchD_0031b7e8_default;
    }
    pNVar3 = AffixTokenMatcherWarehouse::nextCodePointMatcher(this->fWarehouse,cp);
    (*(this->super_TokenConsumer)._vptr_TokenConsumer[3])(this,pNVar3);
  }
  else {
    switch(type) {
    case TYPE_CURRENCY_QUINT:
    case TYPE_CURRENCY_QUAD:
    case TYPE_CURRENCY_TRIPLE:
    case TYPE_CURRENCY_DOUBLE:
    case TYPE_CURRENCY_SINGLE:
      pNVar3 = AffixTokenMatcherWarehouse::currency(this->fWarehouse,status);
      (*(this->super_TokenConsumer)._vptr_TokenConsumer[3])(this,pNVar3);
      break;
    case TYPE_PERMILLE:
      pNVar3 = AffixTokenMatcherWarehouse::permille(this->fWarehouse);
      (*(this->super_TokenConsumer)._vptr_TokenConsumer[3])(this,pNVar3);
      break;
    case TYPE_PERCENT:
      pNVar3 = AffixTokenMatcherWarehouse::percent(this->fWarehouse);
      (*(this->super_TokenConsumer)._vptr_TokenConsumer[3])(this,pNVar3);
      break;
    case TYPE_PLUS_SIGN:
      pNVar3 = AffixTokenMatcherWarehouse::plusSign(this->fWarehouse);
      (*(this->super_TokenConsumer)._vptr_TokenConsumer[3])(this,pNVar3);
      break;
    case TYPE_MINUS_SIGN:
      pNVar3 = AffixTokenMatcherWarehouse::minusSign(this->fWarehouse);
      (*(this->super_TokenConsumer)._vptr_TokenConsumer[3])(this,pNVar3);
    }
  }
switchD_0031b7e8_default:
  local_34 = cp;
  if (type != TYPE_CODEPOINT) {
    local_34 = type;
  }
  this->fLastTypeOrCp = local_34;
  return;
}

Assistant:

void AffixPatternMatcherBuilder::consumeToken(AffixPatternType type, UChar32 cp, UErrorCode& status) {
    // This is called by AffixUtils.iterateWithConsumer() for each token.

    // Add an ignorables matcher between tokens except between two literals, and don't put two
    // ignorables matchers in a row.
    if (fIgnorables != nullptr && fMatchersLen > 0 &&
        (fLastTypeOrCp < 0 || !fIgnorables->getSet()->contains(fLastTypeOrCp))) {
        addMatcher(*fIgnorables);
    }

    if (type != TYPE_CODEPOINT) {
        // Case 1: the token is a symbol.
        switch (type) {
            case TYPE_MINUS_SIGN:
                addMatcher(fWarehouse.minusSign());
                break;
            case TYPE_PLUS_SIGN:
                addMatcher(fWarehouse.plusSign());
                break;
            case TYPE_PERCENT:
                addMatcher(fWarehouse.percent());
                break;
            case TYPE_PERMILLE:
                addMatcher(fWarehouse.permille());
                break;
            case TYPE_CURRENCY_SINGLE:
            case TYPE_CURRENCY_DOUBLE:
            case TYPE_CURRENCY_TRIPLE:
            case TYPE_CURRENCY_QUAD:
            case TYPE_CURRENCY_QUINT:
                // All currency symbols use the same matcher
                addMatcher(fWarehouse.currency(status));
                break;
            default:
                U_ASSERT(FALSE);
        }

    } else if (fIgnorables != nullptr && fIgnorables->getSet()->contains(cp)) {
        // Case 2: the token is an ignorable literal.
        // No action necessary: the ignorables matcher has already been added.

    } else {
        // Case 3: the token is a non-ignorable literal.
        addMatcher(fWarehouse.nextCodePointMatcher(cp));
    }
    fLastTypeOrCp = type != TYPE_CODEPOINT ? type : cp;
}